

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall
cmFindBaseDebugState::FoundAt(cmFindBaseDebugState *this,string *path,string *regexName)

{
  string sStack_78;
  DebugLibState local_58;
  
  if ((this->FindCommand->super_cmFindCommon).DebugMode == true) {
    std::__cxx11::string::string((string *)&sStack_78,(string *)path);
    DebugLibState::DebugLibState(&local_58,regexName,&sStack_78);
    DebugLibState::operator=(&this->FoundSearchLocation,&local_58);
    DebugLibState::~DebugLibState(&local_58);
    std::__cxx11::string::~string((string *)&sStack_78);
  }
  return;
}

Assistant:

void cmFindBaseDebugState::FoundAt(std::string const& path,
                                   std::string regexName)
{
  if (this->FindCommand->DebugMode) {
    this->FoundSearchLocation = DebugLibState{ std::move(regexName), path };
  }
}